

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O3

BitMatrix *
ZXing::Pdf417::BitMatrixFromBitArray
          (BitMatrix *__return_storage_ptr__,
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          *input,int margin)

{
  pointer pvVar1;
  pointer puVar2;
  uint uVar3;
  BitMatrix *extraout_RAX;
  BitMatrix *pBVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  pvVar1 = (input->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar9 = (*(int *)&(((_Bit_iterator *)
                     ((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p -
          *(int *)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data) * 8 +
          *(uint *)((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data + 0x18);
  uVar3 = (int)((long)(input->
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) * -0x33333333
  ;
  BitMatrix::BitMatrix(__return_storage_ptr__,iVar9 + margin * 2,uVar3 + margin * 2);
  pBVar4 = extraout_RAX;
  if (0 < (int)uVar3) {
    pBVar4 = (BitMatrix *)(ulong)(uint)(~margin + __return_storage_ptr__->_height);
    uVar5 = 0;
    do {
      if (0 < iVar9) {
        uVar8 = 0;
        do {
          if ((*(ulong *)(*(long *)&(input->
                                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar5].
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) &
              1) != 0) {
            uVar6 = (ulong)(__return_storage_ptr__->_width * (int)pBVar4 + margin + (int)uVar8);
            puVar2 = (__return_storage_ptr__->_bits).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->_bits).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <= uVar6) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            puVar2[uVar6] = 0xff;
          }
          uVar7 = (int)uVar8 + 1;
          uVar8 = (ulong)uVar7;
        } while ((int)uVar7 < iVar9);
      }
      uVar5 = uVar5 + 1;
      pBVar4 = (BitMatrix *)(ulong)((int)pBVar4 - 1);
    } while (uVar5 != (uVar3 & 0x7fffffff));
  }
  return pBVar4;
}

Assistant:

static BitMatrix BitMatrixFromBitArray(const std::vector<std::vector<bool>>& input, int margin)
{
	// Creates the bitmatrix with extra space for whitespace
	int width = Size(input[0]);
	int height = Size(input);
	BitMatrix result(width + 2 * margin, height + 2 * margin);
	for (int y = 0, yOutput = static_cast<int>(result.height()) - margin - 1; y < height; y++, yOutput--) {
		for (int x = 0; x < width; ++x) {
			// Zero is white in the bytematrix
			if (input[y][x]) {
				result.set(x + margin, yOutput);
			}
		}
	}
	return result;
}